

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O2

void helicsAppRun(HelicsApp app,HelicsError *err)

{
  App *pAVar1;
  
  pAVar1 = getApp(app,err);
  if (pAVar1 != (App *)0x0) {
    (*pAVar1->_vptr_App[3])(pAVar1);
  }
  return;
}

Assistant:

void helicsAppRun(HelicsApp app, HelicsError* err)
{
    auto* happ = getApp(app, err);
    if (happ == nullptr) {
        return;
    }
    try {
        happ->run();
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}